

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_template_checker.cpp
# Opt level: O3

void __thiscall
validation_layer::validationCheckerTemplate::validationCheckerTemplate
          (validationCheckerTemplate *this)

{
  pointer *pppvVar1;
  iterator __position;
  byte *pbVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  context_t *pcVar5;
  uint uVar6;
  validationChecker *local_18;
  
  this->enableValidationCheckerTemplate = false;
  pbVar2 = (byte *)getenv("ZEL_ENABLE_VALIDATION_CHECKER_TEMPLATE");
  if ((pbVar2 != (byte *)0x0) && (*pbVar2 != 0x30)) {
    uVar6 = *pbVar2 - 0x31;
    if (uVar6 == 0) {
      uVar6 = (uint)pbVar2[1];
    }
    this->enableValidationCheckerTemplate = uVar6 == 0;
    if (uVar6 == 0) {
      puVar3 = (undefined8 *)operator_new(8);
      *puVar3 = &PTR_zeInitPrologue_001e5260;
      puVar4 = (undefined8 *)operator_new(8);
      *puVar4 = &PTR_zesInitPrologue_001e5f48;
      DAT_001e85f8 = (undefined8 *)operator_new(8);
      *DAT_001e85f8 = &PTR_zetModuleGetDebugInfoPrologue_001e68d0;
      templateChecker = puVar3;
      DAT_001e85f0 = puVar4;
      pcVar5 = context_t::getInstance();
      local_18 = (validationChecker *)&templateChecker;
      __position._M_current =
           (pcVar5->validationHandlers).
           super__Vector_base<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pcVar5->validationHandlers).
          super__Vector_base<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
        ::_M_realloc_insert<validation_layer::validationChecker*>
                  ((vector<validation_layer::validationChecker*,std::allocator<validation_layer::validationChecker*>>
                    *)&pcVar5->validationHandlers,__position,&local_18);
      }
      else {
        *__position._M_current = (validationChecker *)&templateChecker;
        pppvVar1 = &(pcVar5->validationHandlers).
                    super__Vector_base<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

validationCheckerTemplate::validationCheckerTemplate() {
        enableValidationCheckerTemplate = getenv_tobool( "ZEL_ENABLE_VALIDATION_CHECKER_TEMPLATE" );
        if(enableValidationCheckerTemplate) {
            validationCheckerTemplate::ZEvalidationCheckerTemplate *zeChecker = new validationCheckerTemplate::ZEvalidationCheckerTemplate;
            validationCheckerTemplate::ZESvalidationCheckerTemplate *zesChecker = new validationCheckerTemplate::ZESvalidationCheckerTemplate;
            validationCheckerTemplate::ZETvalidationCheckerTemplate *zetChecker = new validationCheckerTemplate::ZETvalidationCheckerTemplate;
            templateChecker.zeValidation = zeChecker;
            templateChecker.zetValidation = zetChecker;
            templateChecker.zesValidation = zesChecker;
            validation_layer::context.getInstance().validationHandlers.push_back(&templateChecker);
        }
    }